

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<kj::Own<capnp::ClientHook>_> __thiscall
kj::Promise<kj::Own<capnp::ClientHook>>::attach<kj::Own<capnp::ClientHook>>
          (Promise<kj::Own<capnp::ClientHook>> *this,Own<capnp::ClientHook> *attachments)

{
  Own<kj::_::PromiseNode> *params;
  Own<capnp::ClientHook> *params_00;
  NoInfer<kj::Own<capnp::ClientHook>_> *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<kj::Own<capnp::ClientHook>_> PVar1;
  Own<capnp::ClientHook> local_50;
  Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::ClientHook>_>_> local_40;
  Own<kj::_::PromiseNode> local_30;
  NoInfer<kj::Own<capnp::ClientHook>_> *local_20;
  Own<capnp::ClientHook> *attachments_local;
  Promise<kj::Own<capnp::ClientHook>_> *this_local;
  
  local_20 = in_RDX;
  attachments_local = attachments;
  this_local = (Promise<kj::Own<capnp::ClientHook>_> *)this;
  params = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)attachments);
  params_00 = fwd<kj::Own<capnp::ClientHook>>(local_20);
  tuple<kj::Own<capnp::ClientHook>>((kj *)&local_50,params_00);
  heap<kj::_::AttachmentPromiseNode<kj::Own<capnp::ClientHook>>,kj::Own<kj::_::PromiseNode>,kj::Own<capnp::ClientHook>>
            ((kj *)&local_40,params,&local_50);
  Own<kj::_::PromiseNode>::Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::ClientHook>>,void>
            (&local_30,&local_40);
  Promise<kj::Own<capnp::ClientHook>_>::Promise
            ((Promise<kj::Own<capnp::ClientHook>_> *)this,false,&local_30);
  Own<kj::_::PromiseNode>::~Own(&local_30);
  Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::ClientHook>_>_>::~Own(&local_40);
  Own<capnp::ClientHook>::~Own(&local_50);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Own<capnp::ClientHook>_>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}